

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<PropertyDef>::begin(QList<PropertyDef> *this)

{
  PropertyDef *n;
  QArrayDataPointer<PropertyDef> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<PropertyDef> *)0x143519);
  QArrayDataPointer<PropertyDef>::operator->(in_RDI);
  n = QArrayDataPointer<PropertyDef>::begin((QArrayDataPointer<PropertyDef> *)0x14352a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }